

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpsm_cli_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  string_ref query_00;
  bool bVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  char *pcVar3;
  typed_value<unsigned_long,_char> *argv_00;
  typed_value<unsigned_long,_char> *desc;
  char *pcVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  size_type sVar6;
  ostream *this;
  istream *piVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  unsigned_long *puVar9;
  RangeSource<cpsm::StringRefItem,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *src;
  Options *pOVar10;
  RangeSource<cpsm::StringRefItem,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  RVar11;
  Options mopts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  unsigned_long limit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> crfile;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  variables_map opts;
  options_description opts_desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  Options *in_stack_fffffffffffffaf0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffaf8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *in_stack_fffffffffffffb20;
  Options *opts_00;
  allocator *paVar12;
  int style;
  int argc_00;
  string_ref local_3a8;
  Options local_398;
  char *local_368;
  size_t sStack_360;
  size_t local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  allocator local_331;
  string local_330 [32];
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [32];
  Options *local_2c8;
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  undefined1 local_258 [32];
  string local_238 [32];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  basic_parsed_options local_1f0 [40];
  variables_map local_1c8 [167];
  allocator local_121;
  string local_120 [32];
  undefined8 local_100;
  allocator local_f1;
  string local_f0 [32];
  undefined8 local_d0 [3];
  allocator local_b1;
  string local_b0 [32];
  options_description local_90 [140];
  int local_4;
  
  local_4 = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Options",&local_b1);
  boost::program_options::options_description::options_description
            (local_90,local_b0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_d0[0] = boost::program_options::options_description::add_options();
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"",&local_f1);
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d0,(value_semantic *)"crfile",(char *)ptVar2);
  argv_00 = boost::program_options::value<unsigned_long>();
  local_100 = 10;
  desc = boost::program_options::typed_value<unsigned_long,_char>::default_value
                   ((typed_value<unsigned_long,_char> *)in_stack_fffffffffffffb20,
                    (unsigned_long *)in_stack_fffffffffffffb18);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"limit",(char *)desc);
  argc_00 = (int)((ulong)pcVar3 >> 0x20);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",&local_121);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"query",(char *)ptVar5);
  style = (int)((ulong)pcVar4 >> 0x20);
  boost::program_options::options_description_easy_init::operator()(pcVar3,"help");
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  boost::program_options::variables_map::variables_map(local_1c8);
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x144bc0);
  boost::program_options::parse_command_line<char>
            (argc_00,(char **)argv_00,(options_description *)desc,style,
             (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)ptVar2);
  boost::program_options::store(local_1f0,local_1c8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x144c19);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x144c26);
  boost::program_options::notify(local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"help",(allocator *)(local_258 + 0x1f));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_fffffffffffffb00._M_current,in_stack_fffffffffffffaf8._M_current);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)(local_258 + 0x1f));
  if (sVar6 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x144ebb);
    std::__cxx11::string::string(local_278);
    while( true ) {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,local_278);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (!bVar1) break;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb00._M_current,in_stack_fffffffffffffaf8._M_current);
      std::__cxx11::string::clear();
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"crfile",&local_2b9);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x144fab);
    std::__cxx11::string::string(local_298,(string *)pbVar8);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"limit",&local_2e9);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    puVar9 = boost::program_options::variable_value::as<unsigned_long>((variable_value *)0x145033);
    opts_00 = (Options *)*puVar9;
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    paVar12 = &local_331;
    local_2c8 = opts_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"query",paVar12);
    src = (RangeSource<cpsm::StringRefItem,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)boost::program_options::variables_map::operator[]
                       ((variables_map *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x1450c1);
    std::__cxx11::string::string(local_310,(string *)pbVar8);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    local_398.limit_ = 0;
    local_398.match_crfile_ = false;
    local_398._25_3_ = 0;
    local_398.nr_threads_ = 0;
    local_398.crfile_.ptr_ = (char *)0x0;
    local_398.crfile_.len_ = 0;
    local_398.path_ = false;
    local_398.unicode_ = false;
    local_398.want_match_info_ = false;
    local_398._35_5_ = 0;
    cpsm::Options::Options(in_stack_fffffffffffffaf0);
    boost::basic_string_ref<char,std::char_traits<char>>::basic_string_ref<std::allocator<char>>
              (&in_stack_fffffffffffffaf0->crfile_,in_stack_fffffffffffffae8);
    pOVar10 = cpsm::Options::set_crfile(&local_398,local_3a8);
    pOVar10 = cpsm::Options::set_limit(pOVar10,(size_t)local_2c8);
    pOVar10 = cpsm::Options::set_want_match_info(pOVar10,true);
    local_348._0_1_ = pOVar10->path_;
    local_348._1_1_ = pOVar10->unicode_;
    local_348._2_1_ = pOVar10->want_match_info_;
    local_348._3_5_ = *(undefined5 *)&pOVar10->field_0x23;
    local_368 = (pOVar10->crfile_).ptr_;
    sStack_360 = (pOVar10->crfile_).len_;
    local_358 = pOVar10->limit_;
    uStack_350._0_1_ = pOVar10->match_crfile_;
    uStack_350._1_3_ = *(undefined3 *)&pOVar10->field_0x19;
    uStack_350._4_4_ = pOVar10->nr_threads_;
    boost::basic_string_ref<char,std::char_traits<char>>::basic_string_ref<std::allocator<char>>
              (&in_stack_fffffffffffffaf0->crfile_,in_stack_fffffffffffffae8);
    in_stack_fffffffffffffaf0 = (Options *)local_258;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffae8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffae8);
    RVar11 = cpsm::
             source_from_range<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    query_00.len_ = (size_t)puVar9;
    query_00.ptr_ = (char *)paVar12;
    cpsm::
    for_each_match<cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>
              (query_00,opts_00,src,(anon_class_1_0_00000001 *)pbVar8);
    local_4 = 0;
    local_258._24_4_ = 1;
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)RVar11.it_._M_current._M_current);
  }
  else {
    this = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_90);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_258._24_4_ = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_fffffffffffffaf0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_fffffffffffffaf0);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  std::cin.sync_with_stdio(false);
  std::cout.sync_with_stdio(false);
  std::cerr.sync_with_stdio(false);

  po::options_description opts_desc("Options");
  opts_desc.add_options()
      ("crfile", po::value<std::string>()->default_value(""),
       "'currently open file' passed to the matcher")
      ("limit", po::value<std::size_t>()->default_value(10),
       "maximum number of matches to return")
      ("query", po::value<std::string>()->default_value(""),
       "query to match items against")
      ("help", "display this help and exit")
      ;

  po::variables_map opts;
  po::store(po::parse_command_line(argc, argv, opts_desc), opts);
  po::notify(opts);

  if (opts.count("help")) {
    std::cout << opts_desc << std::endl;
    return 0;
  }

  std::vector<std::string> lines;
  std::string line;
  while (std::getline(std::cin, line)) {
    lines.emplace_back(std::move(line));
    line.clear();
  }

  auto const crfile = opts["crfile"].as<std::string>();
  auto const limit = opts["limit"].as<std::size_t>();
  auto const query = opts["query"].as<std::string>();
  auto const mopts =
      cpsm::Options().set_crfile(crfile).set_limit(limit).set_want_match_info(
          true);
  cpsm::for_each_match<cpsm::StringRefItem>(
      query, mopts, cpsm::source_from_range<cpsm::StringRefItem>(lines.cbegin(),
                                                                 lines.cend()),
      [&](cpsm::StringRefItem item, cpsm::MatchInfo const* info) {
        std::cout << item.item() << "\n- score: " << info->score() << "; "
                  << info->score_debug_string() << "\n- match positions: "
                  << cpsm::str_join(info->match_positions(), ", ") << std::endl;
      });

  return 0;
}